

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

token * dmrC_preprocess(dmr_C *C,token *token)

{
  position pVar1;
  int iVar2;
  uint uVar3;
  symbol *psVar4;
  token **line;
  token *ptVar5;
  long lVar6;
  stream *stream;
  bool bVar7;
  token *local_40;
  token *token_local;
  
  C->preprocessing = 1;
  local_40 = token;
  iVar2 = dmrC_init_stream(C,"preprocessor",-1,C->includepath);
  lVar6 = 8;
  do {
    ptVar5 = *(token **)((long)&init_preprocessor_normal + lVar6);
    psVar4 = dmrC_create_symbol(C->S,iVar2,*(char **)(&UNK_0014b1e8 + lVar6),1,0x40);
    (psVar4->field_14).field_0.expansion = ptVar5;
    (psVar4->field_14).field_1.normal = 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x128);
  lVar6 = 8;
  do {
    ptVar5 = *(token **)((long)&init_preprocessor_special + lVar6);
    psVar4 = dmrC_create_symbol(C->S,iVar2,
                                *(char **)((long)&PTR_handle_argv_include_0014b308 + lVar6),1,0x40);
    (psVar4->field_14).field_0.expansion = ptVar5;
    (psVar4->field_14).field_1.normal = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x68);
  C->counter_macro = 0;
  token_local = (token *)&C->token_allocator;
  line = &local_40;
LAB_0011f1dd:
  do {
    while( true ) {
      ptVar5 = *line;
      if (((ulong)ptVar5->pos & 0x3f) == 0x19) {
        do {
          (ptVar5->field_2).number[0x11] = (ptVar5->field_2).number[0x11] & 0xfe;
          ptVar5 = ptVar5->next;
        } while (((ulong)ptVar5->pos & 0x3f) == 0x19);
        *line = ptVar5;
      }
      if (ptVar5 == &dmrC_eof_token_entry_) {
        C->preprocessing = 0;
        return local_40;
      }
      pVar1 = ptVar5->pos;
      uVar3 = pVar1._0_4_;
      stream = (stream *)
               ((long)&C->T->input_streams->fd +
               (ulong)(((uint)((ulong)pVar1 >> 6) & 0x3fff) * 0x48));
      if ((uVar3 >> 0x14 & 1) == 0) break;
      if ((uVar3 & 0x3f) == 0x11) {
        bVar7 = (ptVar5->field_2).special == 0x23;
      }
      else {
        bVar7 = false;
      }
      if (((long)pVar1 < 0) || (!bVar7)) break;
      preprocessor_line(C,stream,line);
LAB_0011f309:
      dmrC_allocator_free((allocator *)token_local,ptVar5);
    }
    if ((uVar3 & 0x3f) != 0x12) {
      if ((uVar3 & 0x3f) == 0x13) {
        if (stream->top_if != (token *)0x0) {
          stream->dirty = 1;
          stream->protect = (ident *)0x0;
          stream->ifndef = (token *)0x0;
          dmrC_sparse_error(C,stream->top_if->pos,"unterminated preprocessor conditional");
          stream->top_if = (token *)0x0;
          C->false_nesting = 0;
        }
        if (stream->dirty == 0) {
          stream->constant = CONSTANT_FILE_YES;
        }
        goto LAB_0011f296;
      }
      if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
        stream->protect = (ident *)0x0;
      }
      if (C->false_nesting != 0) {
        *line = ptVar5->next;
        goto LAB_0011f309;
      }
      if (((ulong)ptVar5->pos & 0x3f) == 2) break;
      goto LAB_0011f339;
    }
LAB_0011f296:
    *line = ptVar5->next;
  } while( true );
  iVar2 = expand_one_symbol(C,line);
  if (iVar2 != 0) {
LAB_0011f339:
    line = &ptVar5->next;
  }
  goto LAB_0011f1dd;
}

Assistant:

struct token * dmrC_preprocess(struct dmr_C *C, struct token *token)
{
	C->preprocessing = 1;
	init_preprocessor(C);
	do_preprocess(C, &token);

	// Drop all expressions from preprocessing, they're not used any more.
	// This is not true when we have multiple files, though ;/
	// clear_expression_alloc();
	C->preprocessing = 0;

	return token;
}